

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<int(int&)>::callback<int(*)(int&)>
          (callback<int(int&)> *this,_func_int_int_ptr *func)

{
  callable_impl<int,_int_(*)(int_&)> *this_00;
  
  this_00 = (callable_impl<int,_int_(*)(int_&)> *)operator_new(0x18);
  callback<int_(int_&)>::callable_impl<int,_int_(*)(int_&)>::callable_impl(this_00,func);
  *(callable_impl<int,_int_(*)(int_&)> **)this = this_00;
  booster::atomic_counter::inc();
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}